

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O0

string * cmQtAutoGen::SubDirPrefix(string *__return_storage_ptr__,string *filename)

{
  ulong uVar1;
  string *filename_local;
  string *res;
  
  cmsys::SystemTools::GetFilenamePath(__return_storage_ptr__,filename);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'/');
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGen::SubDirPrefix(std::string const& filename)
{
  std::string res(cmSystemTools::GetFilenamePath(filename));
  if (!res.empty()) {
    res += '/';
  }
  return res;
}